

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_ws.hpp
# Opt level: O1

string * __thiscall
SimpleWeb::
SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>
::InMessage::string_abi_cxx11_(string *__return_storage_ptr__,InMessage *this)

{
  void *pvVar1;
  void *pvVar2;
  pointer pcVar3;
  const_buffer *pcVar4;
  ulong uVar5;
  size_type __dnew;
  size_type local_80;
  buffers_iterator<asio::const_buffers_1,_char> local_78;
  const_buffer local_40;
  
  pvVar1 = *(void **)(this + 0x30);
  pvVar2 = *(void **)(this + 0x48);
  uVar5 = (long)pvVar2 - (long)pvVar1;
  pcVar4 = &local_40;
  if (uVar5 == 0) {
    pcVar4 = (const_buffer *)&stack0xffffffffffffffd0;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_80 = uVar5;
  local_40.data_ = pvVar1;
  local_40.size_ = uVar5;
  if (0xf < uVar5) {
    pcVar3 = (pointer)std::__cxx11::string::_M_create
                                ((ulong *)__return_storage_ptr__,(ulong)&local_80);
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_80;
  }
  local_78.current_buffer_position_ = 0;
  pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
  local_78.end_ = (buffer_sequence_iterator_type)&stack0xffffffffffffffd0;
  local_78.position_ = 0;
  if (pvVar2 != pvVar1) {
    local_78.current_buffer_.data_ = pvVar1;
    local_78.current_buffer_.size_ = uVar5;
    local_78.begin_ = &local_40;
    local_78.current_ = pcVar4;
    do {
      *pcVar3 = *(char *)((long)local_78.current_buffer_.data_ + local_78.current_buffer_position_);
      asio::buffers_iterator<asio::const_buffers_1,_char>::increment(&local_78);
      pcVar3 = pcVar3 + 1;
    } while (local_78.position_ != uVar5);
  }
  __return_storage_ptr__->_M_string_length = local_80;
  (__return_storage_ptr__->_M_dataplus)._M_p[local_80] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string string() noexcept {
        return std::string(asio::buffers_begin(streambuf.data()), asio::buffers_end(streambuf.data()));
      }